

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExceptions_cpp.h
# Opt level: O0

void __thiscall moira::Moira::execException<(moira::Core)0>(Moira *this,M68kException exc,int nr)

{
  u16 sr;
  ushort nr_00;
  M68kException local_30;
  M68kException local_2c;
  u16 vector;
  u16 status;
  int nr_local;
  M68kException exc_local;
  Moira *this_local;
  
  sr = getSR(this);
  if (exc == TRAP) {
    local_2c = (nr & 0xffffU) + TRAP;
  }
  else {
    if (exc == BKPT) {
      local_30 = ILLEGAL;
    }
    else {
      local_30 = exc & 0xffff;
    }
    local_2c = local_30;
  }
  nr_00 = (ushort)local_2c;
  (*this->_vptr_Moira[0xe])(this,(ulong)exc,(ulong)nr_00);
  this->exception = local_2c & 0xffff;
  setSupervisorMode(this,true);
  clearTraceFlags(this);
  switch(exc) {
  case BUS_ERROR:
    writeStackFrame1011<(moira::Core)0>(this,sr,(this->reg).pc,(this->reg).pc0,2);
    jumpToVector<(moira::Core)0,0ull>(this,2);
    break;
  default:
    break;
  case ILLEGAL:
  case LINEA:
  case LINEF:
    this->flags = this->flags & 0xffffffdf;
    writeStackFrame0000<(moira::Core)0>(this,sr,(this->reg).pc - 2,nr_00);
    jumpToVector<(moira::Core)0,1024ull>(this,local_2c & 0xffff);
    break;
  case DIVIDE_BY_ZERO:
  case CHK:
  case TRAPV:
    writeStackFrame0000<(moira::Core)0>(this,sr,(this->reg).pc,nr_00);
    jumpToVector<(moira::Core)0,10240ull>(this,local_2c & 0xffff);
    break;
  case PRIVILEGE:
    this->flags = this->flags & 0xffffffdf;
    writeStackFrame0000<(moira::Core)0>(this,sr,(this->reg).pc - 2,nr_00);
    jumpToVector<(moira::Core)0,1024ull>(this,local_2c & 0xffff);
    break;
  case TRACE:
    this->flags = this->flags & 0xffffffdf;
    this->flags = this->flags & 0xfffffffd;
    writeStackFrame0000<(moira::Core)0>(this,sr,(this->reg).pc,nr_00);
    jumpToVector<(moira::Core)0,0ull>(this,local_2c & 0xffff);
    break;
  case FORMAT_ERROR:
    this->flags = this->flags & 0xffffffdf;
    writeStackFrame0000<(moira::Core)0>(this,sr,(this->reg).pc,nr_00);
    jumpToVector<(moira::Core)0,1024ull>(this,local_2c & 0xffff);
    break;
  case TRAP:
    writeStackFrame0000<(moira::Core)0>(this,sr,(this->reg).pc,nr_00);
    jumpToVector<(moira::Core)0,0ull>(this,local_2c & 0xffff);
    break;
  case BKPT:
    this->flags = this->flags & 0xffffffdf;
    readM<(moira::Core)0,(moira::Mode)0,2,0ull>(this,(this->reg).pc);
    writeStackFrame0000<(moira::Core)0>(this,sr,(this->reg).pc - 2,nr_00);
    jumpToVector<(moira::Core)0,1024ull>(this,local_2c & 0xffff);
  }
  (*this->_vptr_Moira[0xf])(this,(ulong)exc,(ulong)nr_00);
  return;
}

Assistant:

void
Moira::execException(M68kException exc, int nr)
{
    u16 status = getSR();

    // Determine the exception vector number
    u16 vector = (exc == M68kException::TRAP) ? u16(exc) + u16(nr) : (exc == M68kException::BKPT) ? 4 : u16(exc);

    // Inform the delegate
    willExecute(exc, vector);

    // Remember the exception vector
    exception = vector;

    // Enter supervisor mode and leave trace mode
    setSupervisorMode(true);
    clearTraceFlags();

    switch (exc) {

        case M68kException::BUS_ERROR:

            // Write stack frame
            writeStackFrame1011<C>(status, reg.pc, reg.pc0, 2);

            // Branch to exception handler
            jumpToVector<C>(2);
            break;

        case M68kException::ILLEGAL:
        case M68kException::LINEA:
        case M68kException::LINEF:

            // Clear any pending trace event
            flags &= ~State::TRACE_EXC;

            SYNC(4);

            // Write stack frame
            if (C == Core::C68010 || C == Core::C68020) {
                writeStackFrame0000<C>(status, reg.pc0, vector);
            } else {
                writeStackFrame0000<C>(status, reg.pc - 2, vector);
            }

            // Branch to exception handler
            jumpToVector<C, AE_SET_CB3>(vector);
            break;

        case M68kException::BKPT:

            // Clear any pending trace event
            flags &= ~State::TRACE_EXC;

            SYNC(2);
            (void)readM<C, Mode::DN, Word>(reg.pc);
            SYNC(2);

            // Write stack frame
            writeStackFrame0000<C>(status, U32_SUB(reg.pc, 2), vector);

            // Branch to exception handler
            jumpToVector<C, AE_SET_CB3>(vector);
            break;

        case M68kException::DIVIDE_BY_ZERO:
        case M68kException::CHK:
        case M68kException::TRAPV:

            // Write stack frame
            C == Core::C68020 ?
            writeStackFrame0010<C>(status, reg.pc, reg.pc0, vector) :
            writeStackFrame0000<C>(status, reg.pc, vector);

            // Branch to exception handler
            jumpToVector<C,AE_SET_RW|AE_SET_IF>(vector);
            break;

        case M68kException::PRIVILEGE:

            // Clear any pending trace event
            flags &= ~State::TRACE_EXC;

            SYNC(4);

            // Write stack frame
            writeStackFrame0000<C>(status, reg.pc - 2, vector);

            // Branch to exception handler
            jumpToVector<C,AE_SET_CB3>(vector);
            break;

        case M68kException::TRACE:

            // Clear any pending trace event
            flags &= ~State::TRACE_EXC;

            // Recover from stop state
            flags &= ~State::STOPPED;

            SYNC(4);

            // Write stack frame
            writeStackFrame0000<C>(status, reg.pc, vector);

            // Branch to exception handler
            jumpToVector<C>(vector);
            break;

        case M68kException::FORMAT_ERROR:

            // Clear any pending trace event
            flags &= ~State::TRACE_EXC;

            // Write stack frame
            if (MOIRA_MIMIC_MUSASHI) {
                writeStackFrame0000<C>(status, reg.pc, vector);
            } else {
                writeStackFrame0000<C>(status, reg.pc - 2, vector);
            }

            // Branch to exception handler
            jumpToVector<C, AE_SET_CB3>(vector);
            break;

        case M68kException::TRAP:

            // Write stack frame
            writeStackFrame0000<C>(status, reg.pc, u16(vector));

            // Branch to exception handler
            jumpToVector<C>(vector);
            break;

        default:
            break;
    }

    // Inform the delegate
    didExecute(exc, vector);
}